

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O3

DisasJumpType op_vfa(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  uint uVar2;
  TCGContext_conflict12 *tcg_ctx;
  code *pcVar3;
  uint uVar4;
  code *fn;
  bool bVar5;
  
  uVar1 = (s->fields).presentO;
  if (((uVar1 & 0x20) != 0) && ((uVar1 & 0x40) != 0)) {
    uVar2 = (s->fields).c[4];
    if ((uVar2 & 7) != 0 || (char)(s->fields).c[3] != '\x03') {
      gen_program_exception(s,6);
      return DISAS_NORETURN;
    }
    uVar4 = (uint)(byte)(s->fields).field_0x9;
    if (5 < uVar4 - 0xe2) {
switchD_00cd00cf_caseD_e4:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate_vx.inc.c"
                 ,0xa40,(char *)0x0);
    }
    tcg_ctx = s->uc->tcg_ctx;
    switch(uVar4) {
    case 0xe2:
      bVar5 = (uVar2 & 8) == 0;
      pcVar3 = gen_helper_gvec_vfs64;
      fn = gen_helper_gvec_vfs64s;
      break;
    case 0xe3:
      bVar5 = (uVar2 & 8) == 0;
      pcVar3 = gen_helper_gvec_vfa64;
      fn = gen_helper_gvec_vfa64s;
      break;
    default:
      goto switchD_00cd00cf_caseD_e4;
    case 0xe5:
      bVar5 = (uVar2 & 8) == 0;
      pcVar3 = gen_helper_gvec_vfd64;
      fn = gen_helper_gvec_vfd64s;
      break;
    case 0xe7:
      bVar5 = (uVar2 & 8) == 0;
      pcVar3 = gen_helper_gvec_vfm64;
      fn = gen_helper_gvec_vfm64s;
    }
    if (bVar5) {
      fn = pcVar3;
    }
    if ((uVar1 >> 0x16 & 1) != 0) {
      uVar2 = (s->fields).c[0];
      if ((uVar2 & 0xe0) == 0) {
        if ((uVar1 >> 0x17 & 1) == 0) goto LAB_00cd01a0;
        uVar4 = (s->fields).c[6];
        if ((uVar4 & 0xe0) == 0) {
          if ((uVar1 >> 0x18 & 1) == 0) goto LAB_00cd01a0;
          uVar1 = (s->fields).c[2];
          if ((uVar1 & 0xe0) == 0) {
            tcg_gen_gvec_3_ptr_s390x
                      (tcg_ctx,(uVar2 & 0x1f) * 0x10 + 0x80,(uVar4 & 0x1f) * 0x10 + 0x80,
                       (uVar1 & 0x1f) * 0x10 + 0x80,tcg_ctx->cpu_env,0x10,0x10,0,fn);
            return DISAS_NEXT;
          }
        }
      }
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                 ,0xdf,"reg < 32");
    }
  }
LAB_00cd01a0:
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vfa(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t fpf = get_field(s, m4);
    const uint8_t m5 = get_field(s, m5);
    const bool se = extract32(m5, 3, 1);
    gen_helper_gvec_3_ptr *fn;

    if (fpf != FPF_LONG || extract32(m5, 0, 3)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    switch (s->fields.op2) {
    case 0xe3:
        fn = se ? gen_helper_gvec_vfa64s : gen_helper_gvec_vfa64;
        break;
    case 0xe5:
        fn = se ? gen_helper_gvec_vfd64s : gen_helper_gvec_vfd64;
        break;
    case 0xe7:
        fn = se ? gen_helper_gvec_vfm64s : gen_helper_gvec_vfm64;
        break;
    case 0xe2:
        fn = se ? gen_helper_gvec_vfs64s : gen_helper_gvec_vfs64;
        break;
    default:
        g_assert_not_reached();
    }
    gen_gvec_3_ptr(tcg_ctx, get_field(s, v1), get_field(s, v2),
                   get_field(s, v3), tcg_ctx->cpu_env, 0, fn);
    return DISAS_NEXT;
}